

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

libcaption_stauts_t caption_frame_decode_preamble(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  uint16_t in_SI;
  long in_RDI;
  int uln;
  int chn;
  int col;
  int row;
  eia608_style_t sty;
  byte local_20 [4];
  int local_1c;
  undefined1 local_18 [4];
  undefined1 local_14 [4];
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = in_RDI;
  iVar1 = eia608_parse_preamble
                    (in_SI,(int *)local_14,(int *)local_18,(eia608_style_t *)local_10,&local_1c,
                     (int *)local_20);
  if (iVar1 != 0) {
    *(undefined1 *)(local_8 + 0x39) = local_14[0];
    *(undefined1 *)(local_8 + 0x3a) = local_18[0];
    *(byte *)(local_8 + 0x38) =
         *(byte *)(local_8 + 0x38) & 0xf1 | (local_10[0] & eia608_style_italics) << 1;
    *(byte *)(local_8 + 0x38) = *(byte *)(local_8 + 0x38) & 0xfe | local_20[0] & 1;
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_preamble(caption_frame_t* frame, uint16_t cc_data)
{
    eia608_style_t sty;
    int row, col, chn, uln;

    if (eia608_parse_preamble(cc_data, &row, &col, &sty, &chn, &uln)) {
        frame->state.row = row;
        frame->state.col = col;
        frame->state.sty = sty;
        frame->state.uln = uln;
    }

    return LIBCAPTION_OK;
}